

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

int lys_set_implemented(lys_module *module)

{
  int iVar1;
  unres_schema *unres_00;
  lys_revision *plVar2;
  char *pcVar3;
  ushort uVar4;
  ushort uVar5;
  unres_schema *local_30;
  unres_schema *unres;
  
  if (module == (lys_module *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lys_set_implemented");
    iVar1 = 1;
  }
  else {
    uVar5 = *(ushort *)&module->field_0x40;
    if ((uVar5 & 1) != 0) {
      module = (lys_module *)module->data;
      uVar5 = *(ushort *)&module->field_0x40;
    }
    uVar4 = uVar5;
    if ((uVar5 & 0x40) != 0) {
      lys_set_enabled(module);
      uVar4 = *(ushort *)&module->field_0x40;
    }
    iVar1 = 0;
    if (-1 < (char)uVar4) {
      unres_00 = (unres_schema *)calloc(1,0x28);
      local_30 = unres_00;
      if (unres_00 == (unres_schema *)0x0) {
        iVar1 = 1;
        ly_log(module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_set_implemented"
              );
        if ((uVar5 & 0x40) != 0) {
          lys_set_disabled(module);
        }
      }
      else {
        *(ushort *)&module->field_0x40 = uVar4 | 0x80;
        iVar1 = lys_make_implemented_r(module,unres_00);
        if ((iVar1 == 0) &&
           ((unres_00->count == 0 || (iVar1 = resolve_unres_schema(module,unres_00), iVar1 == 0))))
        {
          iVar1 = 0;
          unres_schema_free((lys_module *)0x0,&local_30,0);
          plVar2 = (lys_revision *)0x1979c2;
          pcVar3 = "@";
          if (module->rev_size == '\0') {
            pcVar3 = "";
          }
          else {
            plVar2 = module->rev;
          }
          ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,"Module \"%s%s%s\" now implemented.",module->name
                 ,pcVar3,plVar2);
        }
        else {
          if ((uVar5 & 0x40) != 0) {
            lys_set_disabled(module);
          }
          module->field_0x40 = module->field_0x40 & 0x7f;
          iVar1 = 1;
          unres_schema_free(module,&local_30,1);
        }
      }
    }
  }
  return iVar1;
}

Assistant:

API int
lys_set_implemented(const struct lys_module *module)
{
    struct unres_schema *unres;
    int disabled = 0;

    if (!module) {
        LOGARG;
        return EXIT_FAILURE;
    }

    module = lys_main_module(module);

    if (module->disabled) {
        disabled = 1;
        lys_set_enabled(module);
    }

    if (module->implemented) {
        return EXIT_SUCCESS;
    }

    unres = calloc(1, sizeof *unres);
    if (!unres) {
        LOGMEM(module->ctx);
        if (disabled) {
            /* set it back disabled */
            lys_set_disabled(module);
        }
        return EXIT_FAILURE;
    }
    /* recursively make the module implemented */
    ((struct lys_module *)module)->implemented = 1;
    if (lys_make_implemented_r((struct lys_module *)module, unres)) {
        goto error;
    }

    /* try again resolve augments in other modules possibly augmenting this one,
     * since we have just enabled it
     */
    /* resolve rest of unres items */
    if (unres->count && resolve_unres_schema((struct lys_module *)module, unres)) {
        goto error;
    }
    unres_schema_free(NULL, &unres, 0);

    LOGVRB("Module \"%s%s%s\" now implemented.", module->name, (module->rev_size ? "@" : ""),
           (module->rev_size ? module->rev[0].date : ""));
    return EXIT_SUCCESS;

error:
    if (disabled) {
        /* set it back disabled */
        lys_set_disabled(module);
    }

    ((struct lys_module *)module)->implemented = 0;
    unres_schema_free((struct lys_module *)module, &unres, 1);
    return EXIT_FAILURE;
}